

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

Instruction * __thiscall LiteScript::Instruction::operator=(Instruction *this,Instruction *i)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  uint len;
  Instruction *i_local;
  Instruction *this_local;
  
  if ((this->comp_type == '\x04') && ((this->comp_value).v_string != (char *)0x0)) {
    operator_delete((this->comp_value).v_string);
  }
  this->code = i->code;
  this->comp_type = i->comp_type;
  switch(this->comp_type) {
  case '\x01':
    (this->comp_value).v_boolean = (bool)((i->comp_value).v_boolean & 1);
    break;
  case '\x02':
    (this->comp_value).v_integer = (i->comp_value).v_integer;
    break;
  case '\x03':
    (this->comp_value).v_integer = (i->comp_value).v_integer;
    break;
  case '\x04':
    sVar2 = strlen((i->comp_value).v_string);
    uVar1 = (int)sVar2 + 1;
    pcVar3 = (char *)operator_new__((ulong)uVar1);
    (this->comp_value).v_string = pcVar3;
    memcpy((this->comp_value).v_string,(i->comp_value).v_string,(ulong)uVar1);
  }
  return this;
}

Assistant:

LiteScript::Instruction & LiteScript::Instruction::operator=(const Instruction &i) {
    if (this->comp_type == CompType::COMP_TYPE_STRING)
        delete this->comp_value.v_string;
    unsigned int len;
    this->code = i.code;
    this->comp_type = i.comp_type;
    switch (this->comp_type) {
        case CompType::COMP_TYPE_BOOLEAN:
            this->comp_value.v_boolean = i.comp_value.v_boolean;
            break;
        case CompType::COMP_TYPE_INTEGER:
            this->comp_value.v_integer = i.comp_value.v_integer;
            break;
        case CompType::COMP_TYPE_FLOAT:
            this->comp_value.v_float = i.comp_value.v_float;
            break;
        case CompType::COMP_TYPE_STRING:
            len = strlen(i.comp_value.v_string) + 1;
            this->comp_value.v_string = new char[len];
            memcpy(this->comp_value.v_string, i.comp_value.v_string, len);
            break;
        default:
            break;
    }
    return *this;
}